

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void once_init(void)

{
  AsyncLogging *pAVar1;
  string *__stat_loc;
  string local_38;
  
  __stat_loc = &local_38;
  pAVar1 = (AsyncLogging *)operator_new(0x1f8);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,Logger::logFileName__abi_cxx11_._M_dataplus._M_p,
             Logger::logFileName__abi_cxx11_._M_dataplus._M_p +
             Logger::logFileName__abi_cxx11_._M_string_length);
  AsyncLogging::AsyncLogging(pAVar1,&local_38,2);
  AsyncLogger_ = pAVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    __stat_loc = (string *)(local_38.field_2._M_allocated_capacity + 1);
    operator_delete(local_38._M_dataplus._M_p,(ulong)__stat_loc);
  }
  pAVar1 = AsyncLogger_;
  AsyncLogger_->running_ = true;
  Thread::start(&pAVar1->thread_);
  CountDownLatch::wait(&pAVar1->latch_,__stat_loc);
  return;
}

Assistant:

void once_init(){
    AsyncLogger_ = new AsyncLogging(Logger::getLogFileName());
    AsyncLogger_->start();
}